

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O1

string * spvLogStringForEnv_abi_cxx11_(string *__return_storage_ptr__,spv_target_env env)

{
  char *pcVar1;
  char *pcVar2;
  
  switch(env) {
  case SPV_ENV_UNIVERSAL_1_0:
  case SPV_ENV_UNIVERSAL_1_1:
  case SPV_ENV_UNIVERSAL_1_2:
  case SPV_ENV_UNIVERSAL_1_3:
  case SPV_ENV_UNIVERSAL_1_4:
  case SPV_ENV_UNIVERSAL_1_5:
  case SPV_ENV_UNIVERSAL_1_6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Universal";
    pcVar1 = "";
    break;
  case SPV_ENV_VULKAN_1_0:
  case SPV_ENV_VULKAN_1_1:
  case SPV_ENV_VULKAN_1_1_SPIRV_1_4:
  case SPV_ENV_VULKAN_1_2:
  case SPV_ENV_VULKAN_1_3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Vulkan";
    pcVar1 = "";
    break;
  case SPV_ENV_OPENCL_2_1:
  case SPV_ENV_OPENCL_2_2:
  case SPV_ENV_OPENCL_1_2:
  case SPV_ENV_OPENCL_EMBEDDED_1_2:
  case SPV_ENV_OPENCL_2_0:
  case SPV_ENV_OPENCL_EMBEDDED_2_0:
  case SPV_ENV_OPENCL_EMBEDDED_2_1:
  case SPV_ENV_OPENCL_EMBEDDED_2_2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "OpenCL";
    pcVar1 = "";
    break;
  case SPV_ENV_OPENGL_4_0:
  case SPV_ENV_OPENGL_4_1:
  case SPV_ENV_OPENGL_4_2:
  case SPV_ENV_OPENGL_4_3:
  case SPV_ENV_OPENGL_4_5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "OpenGL";
    pcVar1 = "";
    break;
  case SPV_ENV_WEBGPU_0:
    __assert_fail("false && \"Deprecated target environment value.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/spirv_target_env.cpp"
                  ,0x188,"std::string spvLogStringForEnv(spv_target_env)");
  case SPV_ENV_MAX:
    __assert_fail("false && \"Invalid target environment value.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/spirv_target_env.cpp"
                  ,0x18b,"std::string spvLogStringForEnv(spv_target_env)");
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Unknown";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string spvLogStringForEnv(spv_target_env env) {
  switch (env) {
    case SPV_ENV_OPENCL_1_2:
    case SPV_ENV_OPENCL_2_0:
    case SPV_ENV_OPENCL_2_1:
    case SPV_ENV_OPENCL_2_2:
    case SPV_ENV_OPENCL_EMBEDDED_1_2:
    case SPV_ENV_OPENCL_EMBEDDED_2_0:
    case SPV_ENV_OPENCL_EMBEDDED_2_1:
    case SPV_ENV_OPENCL_EMBEDDED_2_2: {
      return "OpenCL";
    }
    case SPV_ENV_OPENGL_4_0:
    case SPV_ENV_OPENGL_4_1:
    case SPV_ENV_OPENGL_4_2:
    case SPV_ENV_OPENGL_4_3:
    case SPV_ENV_OPENGL_4_5: {
      return "OpenGL";
    }
    case SPV_ENV_VULKAN_1_0:
    case SPV_ENV_VULKAN_1_1:
    case SPV_ENV_VULKAN_1_1_SPIRV_1_4:
    case SPV_ENV_VULKAN_1_2:
    case SPV_ENV_VULKAN_1_3: {
      return "Vulkan";
    }
    case SPV_ENV_UNIVERSAL_1_0:
    case SPV_ENV_UNIVERSAL_1_1:
    case SPV_ENV_UNIVERSAL_1_2:
    case SPV_ENV_UNIVERSAL_1_3:
    case SPV_ENV_UNIVERSAL_1_4:
    case SPV_ENV_UNIVERSAL_1_5:
    case SPV_ENV_UNIVERSAL_1_6: {
      return "Universal";
    }
    case SPV_ENV_WEBGPU_0:
      assert(false && "Deprecated target environment value.");
      break;
    case SPV_ENV_MAX:
      assert(false && "Invalid target environment value.");
      break;
  }
  return "Unknown";
}